

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pTextureUploadTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Performance::TextureUploadTests::init(TextureUploadTests *this,EVP_PKEY_CTX *ctx)

{
  UploadFunction uploadFunction;
  deUint32 format;
  deUint32 type;
  Context *pCVar1;
  int extraout_EAX;
  int iVar2;
  TestNode *pTVar3;
  TestNode *pTVar4;
  long *plVar5;
  TextureUploadCase *pTVar6;
  long lVar7;
  TestCaseGroup *pTVar8;
  long *plVar9;
  size_type *psVar10;
  long lVar11;
  long local_e8;
  string caseName;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long local_70;
  long local_68;
  TestNode *local_60;
  TestNode *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  pTVar3 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,pCVar1->m_testCtx,"upload","Texture upload");
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00781de0;
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar4 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,pCVar1->m_testCtx,"upload_draw_swap",
             "Texture upload, draw & buffer swap");
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00781de0;
  pTVar4[1]._vptr_TestNode = (_func_int **)pCVar1;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  local_60 = pTVar4;
  local_58 = pTVar3;
  if (init()::textureSizes == '\0') {
    iVar2 = __cxa_guard_acquire(&init()::textureSizes);
    if (iVar2 != 0) {
      init::textureSizes[0].size = 0x10;
      pTVar8 = (TestCaseGroup *)operator_new(0x78);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar8,pCVar1->m_testCtx,"16x16","Texture size 16x16");
      (pTVar8->super_TestCaseGroup).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TestCase_00781de0;
      pTVar8->m_context = pCVar1;
      init::textureSizes[0].uploadCallGroup = pTVar8;
      pTVar8 = (TestCaseGroup *)operator_new(0x78);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar8,pCVar1->m_testCtx,"16x16","Texture size 16x16");
      (pTVar8->super_TestCaseGroup).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TestCase_00781de0;
      pTVar8->m_context = pCVar1;
      init::textureSizes[1].size = 0x100;
      init::textureSizes[0].uploadAndDrawGroup = pTVar8;
      pTVar8 = (TestCaseGroup *)operator_new(0x78);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar8,pCVar1->m_testCtx,"256x256","Texture size 256x256");
      (pTVar8->super_TestCaseGroup).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TestCase_00781de0;
      pTVar8->m_context = pCVar1;
      init::textureSizes[1].uploadCallGroup = pTVar8;
      pTVar8 = (TestCaseGroup *)operator_new(0x78);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar8,pCVar1->m_testCtx,"256x256","Texture size 256x256");
      (pTVar8->super_TestCaseGroup).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TestCase_00781de0;
      pTVar8->m_context = pCVar1;
      init::textureSizes[2].size = 0x101;
      init::textureSizes[1].uploadAndDrawGroup = pTVar8;
      pTVar8 = (TestCaseGroup *)operator_new(0x78);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar8,pCVar1->m_testCtx,"257x257","Texture size 257x257");
      (pTVar8->super_TestCaseGroup).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TestCase_00781de0;
      pTVar8->m_context = pCVar1;
      init::textureSizes[2].uploadCallGroup = pTVar8;
      pTVar8 = (TestCaseGroup *)operator_new(0x78);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar8,pCVar1->m_testCtx,"257x257","Texture size 257x257");
      (pTVar8->super_TestCaseGroup).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TestCase_00781de0;
      pTVar8->m_context = pCVar1;
      init::textureSizes[3].size = 0x400;
      init::textureSizes[2].uploadAndDrawGroup = pTVar8;
      pTVar8 = (TestCaseGroup *)operator_new(0x78);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar8,pCVar1->m_testCtx,"1024x1024","Texture size 1024x1024");
      (pTVar8->super_TestCaseGroup).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TestCase_00781de0;
      pTVar8->m_context = pCVar1;
      init::textureSizes[3].uploadCallGroup = pTVar8;
      pTVar8 = (TestCaseGroup *)operator_new(0x78);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar8,pCVar1->m_testCtx,"1024x1024","Texture size 1024x1024");
      (pTVar8->super_TestCaseGroup).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TestCase_00781de0;
      pTVar8->m_context = pCVar1;
      init::textureSizes[4].size = 0x800;
      init::textureSizes[3].uploadAndDrawGroup = pTVar8;
      pTVar8 = (TestCaseGroup *)operator_new(0x78);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar8,pCVar1->m_testCtx,"2048x2048","Texture size 2048x2048");
      (pTVar8->super_TestCaseGroup).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TestCase_00781de0;
      pTVar8->m_context = pCVar1;
      init::textureSizes[4].uploadCallGroup = pTVar8;
      pTVar8 = (TestCaseGroup *)operator_new(0x78);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar8,pCVar1->m_testCtx,"2048x2048","Texture size 2048x2048");
      (pTVar8->super_TestCaseGroup).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TestCase_00781de0;
      pTVar8->m_context = pCVar1;
      init::textureSizes[4].uploadAndDrawGroup = pTVar8;
      __cxa_guard_release(&init()::textureSizes);
    }
  }
  lVar11 = 0;
  do {
    lVar7 = 0;
    local_70 = lVar11;
    do {
      local_e8 = 0;
      local_68 = lVar7;
      do {
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
        plVar5 = (long *)std::__cxx11::string::append((char *)local_50);
        plVar9 = plVar5 + 2;
        if ((long *)*plVar5 == plVar9) {
          local_a0 = *plVar9;
          lStack_98 = plVar5[3];
          local_b0 = &local_a0;
        }
        else {
          local_a0 = *plVar9;
          local_b0 = (long *)*plVar5;
        }
        local_a8 = plVar5[1];
        *plVar5 = (long)plVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_b0);
        plVar9 = plVar5 + 2;
        if ((long *)*plVar5 == plVar9) {
          local_80 = *plVar9;
          lStack_78 = plVar5[3];
          local_90 = &local_80;
        }
        else {
          local_80 = *plVar9;
          local_90 = (long *)*plVar5;
        }
        local_88 = plVar5[1];
        *plVar5 = (long)plVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_90);
        psVar10 = (size_type *)(plVar5 + 2);
        if ((size_type *)*plVar5 == psVar10) {
          caseName.field_2._M_allocated_capacity = *psVar10;
          caseName.field_2._8_8_ = plVar5[3];
          caseName._M_dataplus._M_p = (pointer)&caseName.field_2;
        }
        else {
          caseName.field_2._M_allocated_capacity = *psVar10;
          caseName._M_dataplus._M_p = (pointer)*plVar5;
        }
        caseName._M_string_length = plVar5[1];
        *plVar5 = (long)psVar10;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if (local_90 != &local_80) {
          operator_delete(local_90,local_80 + 1);
        }
        if (local_b0 != &local_a0) {
          operator_delete(local_b0,local_a0 + 1);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        uploadFunction = init::uploadFunctions[lVar11].func;
        format = *(deUint32 *)((long)&init::textureCombinations[0].format + local_e8);
        type = *(deUint32 *)((long)&init::textureCombinations[0].type + local_e8);
        iVar2 = init::textureSizes[lVar7].size;
        pTVar8 = init::textureSizes[lVar7].uploadCallGroup;
        pTVar6 = (TextureUploadCase *)operator_new(0x130);
        TextureUploadCase::TextureUploadCase
                  (pTVar6,(this->super_TestCaseGroup).m_context,caseName._M_dataplus._M_p,"",
                   uploadFunction,format,type,iVar2);
        (pTVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__TextureUploadCallCase_00795fa8;
        tcu::TestNode::addChild((TestNode *)pTVar8,(TestNode *)pTVar6);
        pTVar8 = init::textureSizes[lVar7].uploadAndDrawGroup;
        pTVar6 = (TextureUploadCase *)operator_new(0x140);
        TextureUploadCase::TextureUploadCase
                  (pTVar6,(this->super_TestCaseGroup).m_context,caseName._M_dataplus._M_p,"",
                   uploadFunction,format,type,iVar2);
        (pTVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__TextureUploadAndDrawCase_00795fe0;
        *(undefined1 *)&pTVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0;
        pTVar6[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
        tcu::TestNode::addChild((TestNode *)pTVar8,(TestNode *)pTVar6);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)caseName._M_dataplus._M_p != &caseName.field_2) {
          operator_delete(caseName._M_dataplus._M_p,caseName.field_2._M_allocated_capacity + 1);
        }
        pTVar4 = local_58;
        pTVar3 = local_60;
        local_e8 = local_e8 + 0x10;
      } while (local_e8 != 0x80);
      lVar7 = local_68 + 1;
    } while (lVar7 != 5);
    lVar11 = local_70 + 1;
  } while (local_70 == 0);
  lVar11 = 0;
  do {
    tcu::TestNode::addChild
              (pTVar4,*(TestNode **)((long)&init::textureSizes[0].uploadCallGroup + lVar11));
    tcu::TestNode::addChild
              (pTVar3,*(TestNode **)((long)&init::textureSizes[0].uploadAndDrawGroup + lVar11));
    lVar11 = lVar11 + 0x18;
  } while (lVar11 != 0x78);
  return extraout_EAX;
}

Assistant:

void TextureUploadTests::init (void)
{
	TestCaseGroup* uploadCall		= new TestCaseGroup(m_context, "upload",			"Texture upload");
	TestCaseGroup* uploadAndDraw	= new TestCaseGroup(m_context, "upload_draw_swap",	"Texture upload, draw & buffer swap");

	addChild(uploadCall);
	addChild(uploadAndDraw);

	static const struct
	{
		const char*		name;
		const char*		nameLower;
		UploadFunction	func;
	} uploadFunctions[] =
	{
		{ "texImage2D",		"teximage2d",		UPLOAD_TEXIMAGE2D },
		{ "texSubImage2D",	"texsubimage2d",	UPLOAD_TEXSUBIMAGE2D }
	};

	static const struct
	{
		const char*	name;
		deUint32	format;
		deUint32	type;
	} textureCombinations[] =
	{
		{ "rgb_ubyte",				GL_RGB,				GL_UNSIGNED_BYTE },
		{ "rgba_ubyte",				GL_RGBA,			GL_UNSIGNED_BYTE },
		{ "alpha_ubyte",			GL_ALPHA,			GL_UNSIGNED_BYTE },
		{ "luminance_ubyte",		GL_LUMINANCE,		GL_UNSIGNED_BYTE },
		{ "luminance-alpha_ubyte",	GL_LUMINANCE_ALPHA,	GL_UNSIGNED_BYTE },
		{ "rgb_ushort565",			GL_RGB,				GL_UNSIGNED_SHORT_5_6_5 },
		{ "rgba_ushort4444",		GL_RGBA,			GL_UNSIGNED_SHORT_4_4_4_4 },
		{ "rgba_ushort5551",		GL_RGBA,			GL_UNSIGNED_SHORT_5_5_5_1 },
	};

	static const struct
	{
		int				size;
		TestCaseGroup*	uploadCallGroup;
		TestCaseGroup*	uploadAndDrawGroup;
	} textureSizes[] =
	{
		{ 16,	new TestCaseGroup(m_context, "16x16",		"Texture size 16x16"),		new TestCaseGroup(m_context, "16x16",		"Texture size 16x16") },
		{ 256,	new TestCaseGroup(m_context, "256x256",		"Texture size 256x256"),	new TestCaseGroup(m_context, "256x256",		"Texture size 256x256") },
		{ 257,	new TestCaseGroup(m_context, "257x257",		"Texture size 257x257"),	new TestCaseGroup(m_context, "257x257",		"Texture size 257x257") },
		{ 1024,	new TestCaseGroup(m_context, "1024x1024",	"Texture size 1024x1024"),	new TestCaseGroup(m_context, "1024x1024",	"Texture size 1024x1024") },
		{ 2048,	new TestCaseGroup(m_context, "2048x2048",	"Texture size 2048x2048"),	new TestCaseGroup(m_context, "2048x2048",	"Texture size 2048x2048") },
	};

#define FOR_EACH(ITERATOR, ARRAY, BODY)	\
	for (int (ITERATOR) = 0; (ITERATOR) < DE_LENGTH_OF_ARRAY(ARRAY); (ITERATOR)++)	\
		BODY

	FOR_EACH(uploadFunc,	 uploadFunctions,
	FOR_EACH(texSize,		 textureSizes,
	FOR_EACH(texCombination, textureCombinations,
	{
		string			caseName	= string("") + uploadFunctions[uploadFunc].nameLower + "_" + textureCombinations[texCombination].name;
		UploadFunction	function	= uploadFunctions[uploadFunc].func;
		deUint32		format		= textureCombinations[texCombination].format;
		deUint32		type		= textureCombinations[texCombination].type;
		int				size		= textureSizes[texSize].size;

		textureSizes[texSize].uploadCallGroup->addChild		(new TextureUploadCallCase		(m_context, caseName.c_str(), "", function, format, type, size));
		textureSizes[texSize].uploadAndDrawGroup->addChild	(new TextureUploadAndDrawCase	(m_context, caseName.c_str(), "", function, format, type, size));
	})));

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(textureSizes); i++)
	{
		uploadCall->addChild	(textureSizes[i].uploadCallGroup);
		uploadAndDraw->addChild	(textureSizes[i].uploadAndDrawGroup);
	}
}